

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_destroy_stream(nghttp2_session *session,nghttp2_stream *stream)

{
  int iVar1;
  int rv;
  nghttp2_mem *mem;
  nghttp2_stream *stream_local;
  nghttp2_session *session_local;
  
  iVar1 = nghttp2_stream_in_dep_tree(stream);
  if ((iVar1 == 0) ||
     (session_local._4_4_ = nghttp2_stream_dep_remove(stream), session_local._4_4_ == 0)) {
    nghttp2_map_remove(&session->streams,stream->stream_id);
    nghttp2_stream_free(stream);
    nghttp2_mem_free(&session->mem,stream);
    session_local._4_4_ = 0;
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_destroy_stream(nghttp2_session *session,
                                   nghttp2_stream *stream) {
  nghttp2_mem *mem;
  int rv;

  DEBUGF("stream: destroy closed stream(%p)=%d\n", stream, stream->stream_id);

  mem = &session->mem;

  if (nghttp2_stream_in_dep_tree(stream)) {
    rv = nghttp2_stream_dep_remove(stream);
    if (rv != 0) {
      return rv;
    }
  }

  nghttp2_map_remove(&session->streams, stream->stream_id);
  nghttp2_stream_free(stream);
  nghttp2_mem_free(mem, stream);

  return 0;
}